

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation.cpp
# Opt level: O2

void __thiscall Simulation::printStatus(Simulation *this,uint64_t it,float dt)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\x1b[2J");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "fluid-simulation - Tristan Marrec 2021 - Supervised by Ryoichi Ando");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"\x1b[1m=== CONFIGURATION ===\x1b[0m");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"\x1b[42m[GRID]\x1b[49m");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"N             = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,Config::N);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"dim           = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,Config::dim);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"\x1b[42m[SOLVER]\x1b[49m");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"solver        = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,Config::solver);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"advection     = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,Config::advection);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"\x1b[42m[FLUID]\x1b[49m");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  std::operator<<((ostream *)&std::cerr,"dt            = ");
  poVar1 = std::ostream::_M_insert<double>(Config::dt);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"\x1b[42m[RENDER]\x1b[49m");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"exportFrames  = ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"renderFrames  = ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"witdh         = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,Config::width);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"height        = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,Config::height);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"endFrame      = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
  poVar1 = std::operator<<((ostream *)&std::cerr,"\x1b[1m=====================\x1b[0m");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (it != 0) {
    std::operator<<((ostream *)&std::cerr,"\x1b[44m\x1b[1m[INFO]\x1b[49m\x1b[0m ");
    poVar1 = std::operator<<((ostream *)&std::cerr,"\x1b[1mITERATION ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"\x1b[0m was computed in ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,dt);
    poVar1 = std::operator<<(poVar1," sec !");
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  return;
}

Assistant:

void Simulation::printStatus(const std::uint64_t it, const float dt) const
{
    std::cout << "\033[2J" << std::endl;
    PRINT_TITLE();
    INFO("\033[1m=== CONFIGURATION ===\033[0m");
    INFO("\033[42m[GRID]\033[49m")
    INFO("N             = " << Config::N);
    INFO("dim           = " << Config::dim);
    INFO("\033[42m[SOLVER]\033[49m")
    INFO("solver        = " << Config::solver);
    INFO("advection     = " << Config::advection);
    INFO("\033[42m[FLUID]\033[49m")
    INFO("dt            = " << Config::dt);
    INFO("\033[42m[RENDER]\033[49m")
    INFO("exportFrames  = " << Config::exportFrames);
    INFO("renderFrames  = " << Config::renderFrames);
    INFO("witdh         = " << Config::width);
    INFO("height        = " << Config::height);
    INFO("endFrame      = " << Config::endFrame);
    INFO("\033[1m=====================\033[0m");
    if (it > 0)
    {
        INFO("\033[1mITERATION " << it << "\033[0m was computed in "
                << dt << " sec !");
    }
}